

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void luaD_seterrorobj(lua_State *L,int errcode,StkId oldtop)

{
  StkId pTVar1;
  TString *pTVar2;
  TValue *io2;
  TValue *io1;
  TString *x__1;
  TValue *io_1;
  TString *x_;
  TValue *io;
  StkId oldtop_local;
  int errcode_local;
  lua_State *L_local;
  
  if (errcode == -2) {
    oldtop->tt_ = 0;
  }
  else if (errcode == 4) {
    pTVar2 = L->l_G->memerrmsg;
    if (9 < (pTVar2->tt & 0xf)) {
      __assert_fail("(((x_)->tt) & 0x0F) < (9+1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,100,"void luaD_seterrorobj(lua_State *, int, StkId)");
    }
    (oldtop->value_).gc = (GCObject *)pTVar2;
    oldtop->tt_ = pTVar2->tt | 0x8000;
    if ((oldtop->tt_ & 0x8000) != 0) {
      if ((oldtop->tt_ & 0x8000) == 0) {
        __assert_fail("(((io)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,100,"void luaD_seterrorobj(lua_State *, int, StkId)");
      }
      if ((oldtop->tt_ & 0x7f) != (ushort)((oldtop->value_).gc)->tt) {
LAB_00122f74:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,100,"void luaD_seterrorobj(lua_State *, int, StkId)");
      }
      if (L != (lua_State *)0x0) {
        if ((oldtop->tt_ & 0x8000) == 0) {
          __assert_fail("(((io)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                        ,100,"void luaD_seterrorobj(lua_State *, int, StkId)");
        }
        if ((((oldtop->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_00122f74;
      }
    }
  }
  else if (errcode == 6) {
    pTVar2 = luaS_newlstr(L,"error in error handling",0x17);
    if (9 < (pTVar2->tt & 0xf)) {
      __assert_fail("(((x_)->tt) & 0x0F) < (9+1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x68,"void luaD_seterrorobj(lua_State *, int, StkId)");
    }
    (oldtop->value_).gc = (GCObject *)pTVar2;
    oldtop->tt_ = pTVar2->tt | 0x8000;
    if ((oldtop->tt_ & 0x8000) != 0) {
      if ((oldtop->tt_ & 0x8000) == 0) {
        __assert_fail("(((io)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x68,"void luaD_seterrorobj(lua_State *, int, StkId)");
      }
      if ((oldtop->tt_ & 0x7f) != (ushort)((oldtop->value_).gc)->tt) {
LAB_001230d3:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x68,"void luaD_seterrorobj(lua_State *, int, StkId)");
      }
      if (L != (lua_State *)0x0) {
        if ((oldtop->tt_ & 0x8000) == 0) {
          __assert_fail("(((io)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                        ,0x68,"void luaD_seterrorobj(lua_State *, int, StkId)");
        }
        if ((((oldtop->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_001230d3;
      }
    }
  }
  else {
    pTVar1 = L->top;
    oldtop->value_ = pTVar1[-1].value_;
    oldtop->tt_ = pTVar1[-1].tt_;
    if ((oldtop->tt_ & 0x8000) != 0) {
      if ((oldtop->tt_ & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x72,"void luaD_seterrorobj(lua_State *, int, StkId)");
      }
      if ((oldtop->tt_ & 0x7f) != (ushort)((oldtop->value_).gc)->tt) {
LAB_00123202:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x72,"void luaD_seterrorobj(lua_State *, int, StkId)");
      }
      if (L != (lua_State *)0x0) {
        if ((oldtop->tt_ & 0x8000) == 0) {
          __assert_fail("(((io1)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                        ,0x72,"void luaD_seterrorobj(lua_State *, int, StkId)");
        }
        if ((((oldtop->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_00123202;
      }
    }
  }
  L->top = oldtop + 1;
  return;
}

Assistant:

void luaD_seterrorobj (lua_State *L, int errcode, StkId oldtop) {
  switch (errcode) {
    case LUA_ERRMEM: {  /* memory error? */
      setsvalue2s(L, oldtop, G(L)->memerrmsg); /* reuse preregistered msg. */
      break;
    }
    case LUA_ERRERR: {
      setsvalue2s(L, oldtop, luaS_newliteral(L, "error in error handling"));
      break;
    }
#ifdef RAVI_DEFER_STATEMENT
    case CLOSEPROTECT: {
      setnilvalue(oldtop);  /* no error message */
      break;
    }
#endif
    default: {
      setobjs2s(L, oldtop, L->top - 1);  /* error message on current top */
      break;
    }
  }
  L->top = oldtop + 1;
}